

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseData<QString>::resolve<QString>(PromiseData<QString> *this,QString *value)

{
  char16_t *pcVar1;
  _func_int **pp_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  QString *__tmp;
  
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  p_Var3->_M_use_count = 1;
  p_Var3->_M_weak_count = 1;
  p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0012bb70;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[1]._M_use_count = 0;
  p_Var3[1]._M_weak_count = 0;
  p_Var3[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var3[1]._vptr__Sp_counted_base = (_func_int **)(value->d).d;
  (value->d).d = (Data *)0x0;
  pcVar1 = *(char16_t **)&p_Var3[1]._M_use_count;
  *(char16_t **)&p_Var3[1]._M_use_count = (value->d).ptr;
  (value->d).ptr = pcVar1;
  pp_Var2 = p_Var3[2]._vptr__Sp_counted_base;
  p_Var3[2]._vptr__Sp_counted_base = (_func_int **)(value->d).size;
  (value->d).size = (qsizetype)pp_Var2;
  (this->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var3 + 1);
  this_00 = (this->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->m_value).m_data.super___shared_ptr<QString,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var3;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  PromiseDataBase<QString,_void_(const_QString_&)>::setSettled
            (&this->super_PromiseDataBase<QString,_void_(const_QString_&)>);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }